

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Global_set(w3Interp *this)

{
  w3Tag wVar1;
  ulong uVar2;
  size_type sVar3;
  w3Tag *pwVar4;
  reference pvVar5;
  Value *pVVar6;
  reference pvVar7;
  ulong uVar8;
  string local_70;
  byte local_39;
  string local_38;
  ulong local_18;
  size_t i;
  w3Interp *this_local;
  
  uVar8 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  local_18 = uVar8;
  i = (size_t)this;
  sVar3 = std::vector<Global,_std::allocator<Global>_>::size(&this->module->globals);
  uVar2 = local_18;
  local_39 = 0;
  if (sVar3 <= uVar8) {
    sVar3 = std::vector<Global,_std::allocator<Global>_>::size(&this->module->globals);
    StringFormat_abi_cxx11_(&local_38,"%lX %lX",uVar2,sVar3);
    local_39 = 1;
    AssertFailedFormat("i < module->globals.size ()",&local_38);
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  pwVar4 = w3Stack::tag(&this->super_w3Stack);
  wVar1 = *pwVar4;
  pvVar5 = std::vector<Global,_std::allocator<Global>_>::operator[](&this->module->globals,local_18)
  ;
  if (wVar1 != (pvVar5->global_type).value_type) {
    pwVar4 = w3Stack::tag(&this->super_w3Stack);
    wVar1 = *pwVar4;
    pvVar5 = std::vector<Global,_std::allocator<Global>_>::operator[]
                       (&this->module->globals,local_18);
    StringFormat_abi_cxx11_(&local_70,"%X %X",(ulong)wVar1,(ulong)(pvVar5->global_type).value_type);
    AssertFailedFormat("tag () == module->globals [i].global_type.value_type",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  pVVar6 = w3Stack::value(&this->super_w3Stack);
  pvVar7 = std::vector<w3StackValue,_std::allocator<w3StackValue>_>::operator[]
                     (&this->module_instance->globals,local_18);
  (pvVar7->value).value = *pVVar6;
  w3Stack::pop_value(&this->super_w3Stack);
  return;
}

Assistant:

INTERP (Global_set)
{
    const size_t i = instr->u32;
    AssertFormat (i < module->globals.size (), ("%" FORMAT_SIZE "X %" FORMAT_SIZE "X", i, module->globals.size ()));
    // TODO assert mutable
    AssertFormat (tag () == module->globals [i].global_type.value_type, ("%X %X", tag (), module->globals [i].global_type.value_type));
    module_instance->globals [i].value.value = value ();
    pop_value ();
}